

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autonomy2.cpp
# Opt level: O2

void __thiscall Autonomy2::mainLoop(Autonomy2 *this,bool *run)

{
  Autonomy2 *this_00;
  double dVar1;
  int iVar2;
  Autonomy2 *pAVar3;
  Autonomy2 *this_01;
  Blob blob;
  Control control;
  list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> blobs;
  vector<Commands::Blob,_std::allocator<Commands::Blob>_> commandBlobs;
  bool tFrame [60] [80];
  float local_1358;
  float fStack_1354;
  Control local_1338;
  undefined1 local_1328 [48];
  
  this_00 = (Autonomy2 *)(local_1328 + 0x18);
  while (*run == true) {
    TripleBuffer<unsigned_short[60][80]>::swapBack(&this->buffer);
    pAVar3 = (Autonomy2 *)&stack0xffffffffffffed08;
    threshold(this,(bool (*) [80])&stack0xffffffffffffed08,(uint16_t (*) [80])(this->buffer).back);
    this_01 = (Autonomy2 *)local_1328;
    findBlobs_abi_cxx11_
              ((list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)local_1328,pAVar3,
               (bool (*) [80])&stack0xffffffffffffed08);
    if (local_1328._16_8_ != 0) {
      blob = findLargestBlob(this_01,(list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)
                                     local_1328);
      iVar2 = TripleBuffer<Autonomy2::Blob>::swapBackIfReady(&this->receivedTargetBuffer);
      if (iVar2 != 0) {
        dVar1 = (double)blob.size;
        if (dVar1 < 0.0) {
          dVar1 = sqrt(dVar1);
        }
        else {
          dVar1 = SQRT(dVar1);
        }
        this->targetDist = (float)dVar1;
      }
      pAVar3 = this_00;
      std::vector<Commands::Blob,_std::allocator<Commands::Blob>_>::vector
                ((vector<Commands::Blob,_std::allocator<Commands::Blob>_> *)this_00,
                 local_1328._16_8_,(allocator_type *)&local_1338);
      blobListToCmdBlobVect
                (pAVar3,(vector<Commands::Blob,_std::allocator<Commands::Blob>_> *)this_00,
                 (list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)local_1328);
      Sender::sendAutonomyBlobs
                (this->send,(vector<Commands::Blob,_std::allocator<Commands::Blob>_> *)this_00);
      local_1358 = blob.x;
      fStack_1354 = blob.y;
      Sender::sendAutonomyBlob(this->send,(int)local_1358,(int)fStack_1354);
      local_1338 = calculateFlightControlsPID(this,blob);
      Sender::sendAutonomyControl(this->send,local_1338);
      ControlArbiter::autonomousControl(this->arbiter,&local_1338);
      std::_Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>::~_Vector_base
                ((_Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_> *)this_00);
    }
    std::__cxx11::_List_base<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_>::_M_clear
              ((_List_base<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)local_1328);
  }
  return;
}

Assistant:

void Autonomy2::mainLoop(bool & run) {
  while (run) {
	  buffer.swapBack();
    bool tFrame[ROWS][COLS];
	  threshold(tFrame, buffer.getBack());
    list<Blob> blobs = findBlobs(tFrame);

    // If there exists blobs
    if (blobs.size()) {
      // Calculate target blob
      Blob targetBlob = findLargestBlob(blobs);
      if (receivedTargetBuffer.swapBackIfReady()) {
        // Received target command
        targetDist = sqrt(targetBlob.size);
      }

      // Send all blobs
      vector<Commands::Blob> commandBlobs(blobs.size());
      blobListToCmdBlobVect(commandBlobs, blobs);
      send.sendAutonomyBlobs(commandBlobs);
      send.sendAutonomyBlob(targetBlob.x, targetBlob.y);

      // Calculate Controls
      Control control = calculateFlightControlsPID(targetBlob);
      send.sendAutonomyControl(control);
      arbiter.autonomousControl(control);
    }
  }
}